

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_WhenAStringReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenAStringReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  char *pcVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  undefined4 extraout_var_00;
  undefined8 uVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var_01;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  char *local_20;
  char *expected_return_value;
  char *default_return_value;
  TEST_MockReturnValueTest_WhenAStringReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
  *this_local;
  
  expected_return_value = "default";
  local_20 = "expected";
  default_return_value = (char *)this;
  SimpleString::SimpleString(&local_30,"");
  pMVar3 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_50);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x100))
            ((long *)CONCAT44(extraout_var,iVar2),local_20);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  pUVar4 = UtestShell::getCurrent();
  pcVar1 = local_20;
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x120))
                    ((long *)CONCAT44(extraout_var_00,iVar2),expected_return_value);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,pcVar1,uVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x26f,pTVar6);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  pcVar1 = local_20;
  SimpleString::SimpleString(&local_80,"");
  pMVar3 = mock(&local_80,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar3->_vptr_MockSupport[0x18])(pMVar3,expected_return_value);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,pcVar1,CONCAT44(extraout_var_01,iVar2),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x270,pTVar6);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenAStringReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    const char * default_return_value = "default";
    const char * expected_return_value = "expected";
    mock().expectOneCall("foo").andReturnValue(expected_return_value);
    STRCMP_EQUAL(expected_return_value, mock().actualCall("foo").returnStringValueOrDefault(default_return_value));
    STRCMP_EQUAL(expected_return_value, mock().returnStringValueOrDefault(default_return_value));
}